

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::TableEndRow(ImGuiTable *table)

{
  float fVar1;
  float fVar2;
  ImGuiWindow *pIVar3;
  ImDrawList *pIVar4;
  bool bVar5;
  ImGuiTableCellData *pIVar6;
  long in_RDI;
  float fVar7;
  float fVar8;
  ImVec4 IVar9;
  ImGuiTableColumn *column_1;
  int column_n;
  float row_height;
  ImRect r;
  ImRect cell_rect;
  ImGuiTableColumn *column;
  ImGuiTableCellData *cell_data;
  ImGuiTableCellData *cell_data_end;
  ImRect row_rect;
  bool draw_strong_bottom_border;
  bool draw_cell_bg_color;
  float border_size;
  ImU32 border_col;
  ImU32 bg_col1;
  ImU32 bg_col0;
  bool is_visible;
  bool unfreeze_rows;
  float bg_y2;
  float bg_y1;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImDrawList *in_stack_ffffffffffffff30;
  float in_stack_ffffffffffffff38;
  undefined2 in_stack_ffffffffffffff3c;
  undefined1 uVar10;
  bool bVar11;
  undefined1 uVar12;
  ImGuiTable *in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff48;
  int iVar13;
  undefined4 in_stack_ffffffffffffff4c;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 uVar14;
  undefined4 in_stack_ffffffffffffff54;
  ImVec2 local_a0;
  ImVec2 local_98;
  ImVec2 local_90;
  float in_stack_ffffffffffffff78;
  float in_stack_ffffffffffffff7c;
  ImVec2 *in_stack_ffffffffffffff80;
  ImVec2 *in_stack_ffffffffffffff88;
  ImDrawList *in_stack_ffffffffffffff90;
  ImGuiTableCellData *local_68;
  float local_54;
  float local_4c;
  undefined8 local_48;
  undefined8 local_40;
  float local_30;
  int local_2c;
  ImU32 local_28;
  
  pIVar3 = GImGui->CurrentWindow;
  if (pIVar3 != *(ImGuiWindow **)(in_RDI + 0x168)) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_widgets.cpp"
                ,0x24f5,"TableEndRow","ImGui ASSERT FAILED: %s","window == table->InnerWindow");
  }
  if ((*(byte *)(in_RDI + 0x1d3) & 1) == 0) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_widgets.cpp"
                ,0x24f6,"TableEndRow","ImGui ASSERT FAILED: %s","table->IsInsideRow");
  }
  TableEndCell(in_stack_ffffffffffffff40);
  (pIVar3->DC).CursorPos.y = *(float *)(in_RDI + 0x84);
  fVar1 = *(float *)(in_RDI + 0x80);
  fVar2 = *(float *)(in_RDI + 0x84);
  bVar11 = false;
  if (*(int *)(in_RDI + 0x78) + 1 == (int)*(char *)(in_RDI + 0x1ce)) {
    bVar11 = '\0' < *(char *)(in_RDI + 0x1ce);
  }
  if (*(int *)(in_RDI + 0x78) == 0) {
    *(float *)(in_RDI + 0xcc) = fVar2 - fVar1;
  }
  uVar10 = false;
  if ((-1 < *(int *)(in_RDI + 0x78)) && (uVar10 = false, *(float *)(in_RDI + 0x108) <= fVar2)) {
    uVar10 = fVar1 <= *(float *)(in_RDI + 0x110);
  }
  uVar12 = bVar11;
  if ((bool)uVar10 != false) {
    local_28 = 0;
    local_2c = 0;
    if (*(int *)(in_RDI + 0x9c) == 0x1000000) {
      if ((*(uint *)(in_RDI + 4) & 0x40) != 0) {
        local_28 = GetColorU32((ImGuiCol)((ulong)in_stack_ffffffffffffff40 >> 0x20),
                               SUB84(in_stack_ffffffffffffff40,0));
      }
    }
    else {
      local_28 = *(ImU32 *)(in_RDI + 0x9c);
    }
    if (*(int *)(in_RDI + 0xa0) != 0x1000000) {
      local_2c = *(int *)(in_RDI + 0xa0);
    }
    local_30 = 0.0;
    if ((((*(int *)(in_RDI + 0x78) != 0) || (*(long *)(in_RDI + 0x168) == *(long *)(in_RDI + 0x160))
         ) && ((*(uint *)(in_RDI + 4) & 0x80) != 0)) && (0 < *(int *)(in_RDI + 0x78))) {
      if ((*(int *)(in_RDI + 0x94) >> 0x10 & 1U) == 0) {
        in_stack_ffffffffffffff38 = *(float *)(in_RDI + 0xa8);
        local_30 = in_stack_ffffffffffffff38;
      }
      else {
        in_stack_ffffffffffffff38 = *(float *)(in_RDI + 0xa4);
        local_30 = in_stack_ffffffffffffff38;
      }
    }
    bVar5 = '\0' < *(char *)(in_RDI + 0x1d1);
    if ((((local_28 != 0 || local_2c != 0) || local_30 != 0.0) || (bVar11 != false)) || (bVar5)) {
      IVar9 = ImRect::ToVec4((ImRect *)0x2d5477);
      pIVar4 = pIVar3->DrawList;
      local_48 = IVar9._0_8_;
      (pIVar4->_CmdHeader).ClipRect.x = (float)(undefined4)local_48;
      (pIVar4->_CmdHeader).ClipRect.y = (float)local_48._4_4_;
      local_40 = IVar9._8_8_;
      (pIVar4->_CmdHeader).ClipRect.z = (float)(undefined4)local_40;
      (pIVar4->_CmdHeader).ClipRect.w = (float)local_40._4_4_;
      ImDrawListSplitter::SetCurrentChannel
                ((ImDrawListSplitter *)in_stack_ffffffffffffff40,
                 (ImDrawList *)
                 CONCAT17(uVar12,CONCAT16(uVar10,CONCAT24(in_stack_ffffffffffffff3c,
                                                          in_stack_ffffffffffffff38))),
                 (int)((ulong)in_stack_ffffffffffffff30 >> 0x20));
    }
    if ((local_28 != 0) || (local_2c != 0)) {
      ImRect::ImRect((ImRect *)in_stack_ffffffffffffff40,
                     (float)CONCAT13(uVar12,CONCAT12(uVar10,in_stack_ffffffffffffff3c)),
                     in_stack_ffffffffffffff38,(float)((ulong)in_stack_ffffffffffffff30 >> 0x20),
                     SUB84(in_stack_ffffffffffffff30,0));
      ImRect::ClipWith((ImRect *)in_stack_ffffffffffffff40,
                       (ImRect *)
                       CONCAT17(uVar12,CONCAT16(uVar10,CONCAT24(in_stack_ffffffffffffff3c,
                                                                in_stack_ffffffffffffff38))));
      if ((local_28 != 0) && (local_54 < local_4c)) {
        ImDrawList::AddRectFilled
                  ((ImDrawList *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                   (ImVec2 *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                   (ImVec2 *)in_stack_ffffffffffffff40,
                   CONCAT13(uVar12,CONCAT12(uVar10,in_stack_ffffffffffffff3c)),
                   in_stack_ffffffffffffff38,
                   (ImDrawCornerFlags)((ulong)in_stack_ffffffffffffff30 >> 0x20));
      }
      if ((local_2c != 0) && (local_54 < local_4c)) {
        ImDrawList::AddRectFilled
                  ((ImDrawList *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                   (ImVec2 *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                   (ImVec2 *)in_stack_ffffffffffffff40,
                   CONCAT13(uVar12,CONCAT12(uVar10,in_stack_ffffffffffffff3c)),
                   in_stack_ffffffffffffff38,
                   (ImDrawCornerFlags)((ulong)in_stack_ffffffffffffff30 >> 0x20));
      }
    }
    if (bVar5) {
      pIVar6 = ImSpan<ImGuiTableCellData>::operator[]
                         ((ImSpan<ImGuiTableCellData> *)in_stack_ffffffffffffff40,
                          CONCAT13(uVar12,CONCAT12(uVar10,in_stack_ffffffffffffff3c)));
      for (local_68 = ImSpan<ImGuiTableCellData>::operator[]
                                ((ImSpan<ImGuiTableCellData> *)in_stack_ffffffffffffff40,
                                 CONCAT13(uVar12,CONCAT12(uVar10,in_stack_ffffffffffffff3c)));
          local_68 <= pIVar6; local_68 = local_68 + 1) {
        in_stack_ffffffffffffff90 =
             (ImDrawList *)
             ImSpan<ImGuiTableColumn>::operator[]
                       ((ImSpan<ImGuiTableColumn> *)in_stack_ffffffffffffff40,
                        CONCAT13(uVar12,CONCAT12(uVar10,in_stack_ffffffffffffff3c)));
        ImRect::ImRect((ImRect *)in_stack_ffffffffffffff40,
                       (float)CONCAT13(uVar12,CONCAT12(uVar10,in_stack_ffffffffffffff3c)),
                       in_stack_ffffffffffffff38,(float)((ulong)in_stack_ffffffffffffff30 >> 0x20),
                       SUB84(in_stack_ffffffffffffff30,0));
        ImRect::ClipWith((ImRect *)in_stack_ffffffffffffff40,
                         (ImRect *)
                         CONCAT17(uVar12,CONCAT16(uVar10,CONCAT24(in_stack_ffffffffffffff3c,
                                                                  in_stack_ffffffffffffff38))));
        ImDrawList::AddRectFilled
                  ((ImDrawList *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                   (ImVec2 *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                   (ImVec2 *)in_stack_ffffffffffffff40,
                   CONCAT13(uVar12,CONCAT12(uVar10,in_stack_ffffffffffffff3c)),
                   in_stack_ffffffffffffff38,
                   (ImDrawCornerFlags)((ulong)in_stack_ffffffffffffff30 >> 0x20));
      }
    }
    if (((local_30 != 0.0) && (*(float *)(in_RDI + 0x118) <= fVar1)) &&
       (fVar1 < *(float *)(in_RDI + 0x120))) {
      in_stack_ffffffffffffff30 = pIVar3->DrawList;
      ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff78,*(float *)(in_RDI + 0xac),fVar1);
      ImVec2::ImVec2(&local_90,*(float *)(in_RDI + 0xb0),fVar1);
      ImDrawList::AddLine(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                          in_stack_ffffffffffffff80,(ImU32)in_stack_ffffffffffffff7c,
                          in_stack_ffffffffffffff78);
    }
    if (((bVar11 != false) && (*(float *)(in_RDI + 0x118) <= fVar2)) &&
       (fVar2 < *(float *)(in_RDI + 0x120))) {
      ImVec2::ImVec2(&local_98,*(float *)(in_RDI + 0xac),fVar2);
      ImVec2::ImVec2(&local_a0,*(float *)(in_RDI + 0xb0),fVar2);
      ImDrawList::AddLine(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                          in_stack_ffffffffffffff80,(ImU32)in_stack_ffffffffffffff7c,
                          in_stack_ffffffffffffff78);
    }
  }
  if (bVar11 != false) {
    if ((*(byte *)(in_RDI + 0x1dd) & 1) != 0) {
      LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_widgets.cpp"
                  ,0x255a,"TableEndRow","ImGui ASSERT FAILED: %s",
                  "table->IsFreezeRowsPassed == false");
    }
    *(undefined1 *)(in_RDI + 0x1dd) = 1;
    ImDrawListSplitter::SetCurrentChannel
              ((ImDrawListSplitter *)in_stack_ffffffffffffff40,
               (ImDrawList *)
               CONCAT17(uVar12,CONCAT16(uVar10,CONCAT24(in_stack_ffffffffffffff3c,
                                                        in_stack_ffffffffffffff38))),
               (int)((ulong)in_stack_ffffffffffffff30 >> 0x20));
    ImRect::ImRect((ImRect *)in_stack_ffffffffffffff30);
    uVar14 = *(undefined4 *)(in_RDI + 0x104);
    fVar7 = ImMax<float>(*(float *)(in_RDI + 0x84) + 1.0,(pIVar3->InnerClipRect).Min.y);
    fVar1 = (pIVar3->InnerClipRect).Max.y;
    *(ulong *)(in_RDI + 0x114) = CONCAT44(fVar7,uVar14);
    *(ulong *)(in_RDI + 0x11c) = CONCAT44(fVar1,*(undefined4 *)(in_RDI + 0x10c));
    fVar1 = *(float *)(in_RDI + 0x84);
    fVar2 = *(float *)(in_RDI + 0x80);
    fVar8 = (*(float *)(in_RDI + 0xf8) + *(float *)(in_RDI + 0x84)) - *(float *)(in_RDI + 0xe8);
    (pIVar3->DC).CursorPos.y = fVar8;
    *(float *)(in_RDI + 0x84) = fVar8;
    *(float *)(in_RDI + 0x80) = *(float *)(in_RDI + 0x84) - (fVar1 - fVar2);
    for (iVar13 = 0; iVar13 < *(int *)(in_RDI + 0x6c); iVar13 = iVar13 + 1) {
      in_stack_ffffffffffffff40 =
           (ImGuiTable *)
           ImSpan<ImGuiTableColumn>::operator[]
                     ((ImSpan<ImGuiTableColumn> *)in_stack_ffffffffffffff40,
                      CONCAT13(uVar12,CONCAT12(uVar10,in_stack_ffffffffffffff3c)));
      *(ImS8 *)((long)&in_stack_ffffffffffffff40->VisibleUnclippedMaskByIndex + 4) =
           *(ImS8 *)((long)&in_stack_ffffffffffffff40->VisibleUnclippedMaskByIndex + 6);
      in_stack_ffffffffffffff40->Flags = (ImGuiTableFlags)fVar7;
    }
  }
  if ((*(uint *)(in_RDI + 0x94) & 1) == 0) {
    *(int *)(in_RDI + 0x98) = *(int *)(in_RDI + 0x98) + 1;
  }
  *(undefined1 *)(in_RDI + 0x1d3) = 0;
  return;
}

Assistant:

void    ImGui::TableEndRow(ImGuiTable* table)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    IM_ASSERT(window == table->InnerWindow);
    IM_ASSERT(table->IsInsideRow);

    TableEndCell(table);

    // Position cursor at the bottom of our row so it can be used for e.g. clipping calculation. However it is
    // likely that the next call to TableBeginCell() will reposition the cursor to take account of vertical padding.
    window->DC.CursorPos.y = table->RowPosY2;

    // Row background fill
    const float bg_y1 = table->RowPosY1;
    const float bg_y2 = table->RowPosY2;

    const bool unfreeze_rows = (table->CurrentRow + 1 == table->FreezeRowsCount && table->FreezeRowsCount > 0);

    if (table->CurrentRow == 0)
        table->LastFirstRowHeight = bg_y2 - bg_y1;

    const bool is_visible = table->CurrentRow >= 0 && bg_y2 >= table->InnerClipRect.Min.y && bg_y1 <= table->InnerClipRect.Max.y;
    if (is_visible)
    {
        // Decide of background color for the row
        ImU32 bg_col0 = 0;
        ImU32 bg_col1 = 0;
        if (table->RowBgColor[0] != IM_COL32_DISABLE)
            bg_col0 = table->RowBgColor[0];
        else if (table->Flags & ImGuiTableFlags_RowBg)
            bg_col0 = GetColorU32((table->RowBgColorCounter & 1) ? ImGuiCol_TableRowBgAlt : ImGuiCol_TableRowBg);
        if (table->RowBgColor[1] != IM_COL32_DISABLE)
            bg_col1 = table->RowBgColor[1];

        // Decide of top border color
        ImU32 border_col = 0;
        const float border_size = TABLE_BORDER_SIZE;
        if (table->CurrentRow != 0 || table->InnerWindow == table->OuterWindow)
        {
            if (table->Flags & ImGuiTableFlags_BordersInnerH)
            {
                //if (table->CurrentRow == 0 && table->InnerWindow == table->OuterWindow)
                //    border_col = table->BorderOuterColor;
                //else
                if (table->CurrentRow > 0)// && !(table->LastRowFlags & ImGuiTableRowFlags_Headers))
                    border_col = (table->LastRowFlags & ImGuiTableRowFlags_Headers) ? table->BorderColorStrong : table->BorderColorLight;
            }
            else
            {
                //if (table->RowFlags & ImGuiTableRowFlags_Headers)
                //    border_col = table->BorderOuterColor;
            }
        }

        const bool draw_cell_bg_color = table->RowCellDataCount > 0;
        const bool draw_strong_bottom_border = unfreeze_rows;// || (table->RowFlags & ImGuiTableRowFlags_Headers);
        if ((bg_col0 | bg_col1 | border_col) != 0 || draw_strong_bottom_border || draw_cell_bg_color)
        {
            // In theory we could call SetWindowClipRectBeforeChannelChange() but since we know TableEndRow() is
            // always followed by a change of clipping rectangle we perform the smallest overwrite possible here.
            window->DrawList->_CmdHeader.ClipRect = table->HostClipRect.ToVec4();
            table->DrawSplitter.SetCurrentChannel(window->DrawList, 0);
        }

        // Draw row background
        // We soft/cpu clip this so all backgrounds and borders can share the same clipping rectangle
        if (bg_col0 || bg_col1)
        {
            ImRect row_rect(table->WorkRect.Min.x, bg_y1, table->WorkRect.Max.x, bg_y2);
            row_rect.ClipWith(table->BackgroundClipRect);
            if (bg_col0 != 0 && row_rect.Min.y < row_rect.Max.y)
                window->DrawList->AddRectFilled(row_rect.Min, row_rect.Max, bg_col0);
            if (bg_col1 != 0 && row_rect.Min.y < row_rect.Max.y)
                window->DrawList->AddRectFilled(row_rect.Min, row_rect.Max, bg_col1);
        }

        // Draw cell background color
        if (draw_cell_bg_color)
        {
            ImGuiTableCellData* cell_data_end = &table->RowCellData[table->RowCellDataCount - 1];
            for (ImGuiTableCellData* cell_data = &table->RowCellData[0]; cell_data <= cell_data_end; cell_data++)
            {
                ImGuiTableColumn* column = &table->Columns[cell_data->Column];
                ImRect cell_rect(column->MinX - table->CellSpacingX, bg_y1, column->MaxX, bg_y2); // FIXME-TABLE: Padding currently wrong until we finish the padding refactor
                cell_rect.ClipWith(table->BackgroundClipRect);
                window->DrawList->AddRectFilled(cell_rect.Min, cell_rect.Max, cell_data->BgColor);
            }
        }

        // Draw top border
        if (border_col && bg_y1 >= table->BackgroundClipRect.Min.y && bg_y1 < table->BackgroundClipRect.Max.y)
            window->DrawList->AddLine(ImVec2(table->BorderX1, bg_y1), ImVec2(table->BorderX2, bg_y1), border_col, border_size);

        // Draw bottom border at the row unfreezing mark (always strong)
        if (draw_strong_bottom_border)
            if (bg_y2 >= table->BackgroundClipRect.Min.y && bg_y2 < table->BackgroundClipRect.Max.y)
                window->DrawList->AddLine(ImVec2(table->BorderX1, bg_y2), ImVec2(table->BorderX2, bg_y2), table->BorderColorStrong, border_size);
    }

    // End frozen rows (when we are past the last frozen row line, teleport cursor and alter clipping rectangle)
    // We need to do that in TableEndRow() instead of TableBeginRow() so the list clipper can mark end of row and
    // get the new cursor position.
    if (unfreeze_rows)
    {
        IM_ASSERT(table->IsFreezeRowsPassed == false);
        table->IsFreezeRowsPassed = true;
        table->DrawSplitter.SetCurrentChannel(window->DrawList, 0);

        ImRect r;
        r.Min.x = table->InnerClipRect.Min.x;
        r.Min.y = ImMax(table->RowPosY2 + 1, window->InnerClipRect.Min.y);
        r.Max.x = table->InnerClipRect.Max.x;
        r.Max.y = window->InnerClipRect.Max.y;
        table->BackgroundClipRect = r;

        float row_height = table->RowPosY2 - table->RowPosY1;
        table->RowPosY2 = window->DC.CursorPos.y = table->WorkRect.Min.y + table->RowPosY2 - table->OuterRect.Min.y;
        table->RowPosY1 = table->RowPosY2 - row_height;
        for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
        {
            ImGuiTableColumn* column = &table->Columns[column_n];
            column->DrawChannelCurrent = column->DrawChannelRowsAfterFreeze;
            column->ClipRect.Min.y = r.Min.y;
        }
    }

    if (!(table->RowFlags & ImGuiTableRowFlags_Headers))
        table->RowBgColorCounter++;
    table->IsInsideRow = false;
}